

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  char cVar1;
  LYS_NODE LVar2;
  char *__s2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  lys_node *plVar7;
  uint8_t *puVar8;
  lys_module *plVar9;
  lys_module *plVar10;
  ushort **ppuVar11;
  undefined4 extraout_var_00;
  LY_ERR *pLVar12;
  lyd_node *plVar13;
  char *pcVar14;
  LY_ECODE code;
  char *pcVar15;
  size_t sVar16;
  ulong uVar17;
  lyd_node *node;
  lyd_node *node_00;
  bool bVar18;
  char *local_100;
  char *pred_name;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *value;
  lyd_node *local_c8;
  int local_c0;
  uint local_bc;
  int pred_name_len;
  char *llist_value_local;
  char *name;
  char *local_a0;
  char *local_98;
  char *mod_name;
  ulong local_88;
  int local_80;
  int local_7c;
  int val_len;
  int nam_len;
  int llval_len;
  int last_has_pred;
  char *local_68;
  char *name_1;
  int local_58;
  int local_54;
  char *pcStack_50;
  int is_relative;
  int local_48;
  int local_44;
  int nam_len_1;
  int has_predicate;
  int local_38;
  uint local_34;
  int mod_name_len;
  
  local_bc = options;
  _pred_name_len = llist_value;
  value = ly_buf();
  local_54 = -1;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x8f8,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  pred_name = (char *)start->schema->module->ctx;
  uVar4 = parse_schema_nodeid(nodeid,&local_98,&local_38,&llist_value_local,&local_7c,&local_54,
                              &local_44);
  if (0 < (int)uVar4) {
    _nam_len_1 = parsed;
    mod_name = (char *)CONCAT44(extraout_var,uVar4);
    if (local_54 == 0) {
      do {
        node = start;
        start = node->parent;
      } while (node->parent != (lyd_node *)0x0);
      name = (char *)lyd_node_module(node);
    }
    else {
      name = (char *)lyd_node_module(start);
      node = start->child;
    }
    pcVar15 = nodeid + uVar4;
    plVar13 = (lyd_node *)0x0;
    local_f0 = nodeid;
    do {
      bVar18 = node == (lyd_node *)0x0;
      if (!bVar18) {
        llval_len = 0;
        node_00 = node;
        local_c8 = plVar13;
        pcStack_50 = pcVar15;
        do {
          plVar7 = lys_parent(node_00->schema);
          if (plVar7 != (lys_node *)0x0) {
            plVar7 = lys_parent(node_00->schema);
            if ((local_bc & 4) == 0) {
              if (plVar7->nodetype == LYS_OUTPUT) {
                pLVar12 = ly_errno_location();
                *pLVar12 = LY_EINVAL;
                pcVar15 = node_00->schema->name;
                pcVar14 = "Provided data tree includes some RPC output nodes (%s).";
LAB_00116012:
                ly_log(LY_LLERR,pcVar14,pcVar15);
                goto LAB_0011601f;
              }
            }
            else if (plVar7->nodetype == LYS_INPUT) {
              pLVar12 = ly_errno_location();
              *pLVar12 = LY_EINVAL;
              pcVar15 = node_00->schema->name;
              pcVar14 = "Provided data tree includes some RPC input nodes (%s).";
              goto LAB_00116012;
            }
          }
          pcVar15 = node_00->schema->name;
          sVar16 = (size_t)local_7c;
          iVar5 = strncmp(llist_value_local,pcVar15,sVar16);
          if ((iVar5 == 0) && (pcVar15[sVar16] == '\0')) {
            plVar9 = (lys_module *)name;
            if (local_98 != (char *)0x0) {
              if (0x3ff < local_38) {
                pLVar12 = ly_errno_location();
                *pLVar12 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                       ,0x929);
                goto LAB_0011601f;
              }
              puVar8 = ly_buf_used_location();
              pcVar15 = value;
              if (*puVar8 == '\0') {
                pcVar14 = (char *)0x0;
              }
              else if (*value == '\0') {
                pcVar14 = (char *)0x0;
              }
              else {
                pcVar14 = strndup(value,0x3ff);
              }
              puVar8 = ly_buf_used_location();
              *puVar8 = *puVar8 + '\x01';
              memmove(pcVar15,local_98,(long)local_38);
              pcVar15[local_38] = '\0';
              plVar9 = ly_ctx_get_module((ly_ctx *)pred_name,pcVar15,(char *)0x0);
              if (pcVar14 != (char *)0x0) {
                strncpy(pcVar15,pcVar14,0x3ff);
                free(pcVar14);
              }
              puVar8 = ly_buf_used_location();
              *puVar8 = *puVar8 + 0xff;
              if (plVar9 == (lys_module *)0x0) {
                pcVar15 = strndup(local_f0,(size_t)(local_98 + ((long)local_38 - (long)local_f0)));
                ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,pcVar15);
                free(pcVar15);
                goto LAB_0011601f;
              }
            }
            plVar10 = lyd_node_module(node_00);
            pcVar14 = pcStack_50;
            pcVar15 = llist_value_local;
            if (plVar9 == plVar10) {
              LVar2 = node_00->schema->nodetype;
              if (LVar2 == LYS_LIST) {
                if (local_44 == 0) {
                  return local_c8;
                }
                local_58 = 1;
                if (node_00->schema->nodetype != LYS_LIST) {
                  __assert_fail("node->schema->nodetype == LYS_LIST",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                                ,0x891,
                                "int resolve_partial_json_data_list_predicate(const char *, const char *, struct lyd_node *, int, int *)"
                               );
                }
                llval_len = llval_len + 1;
                local_34 = parse_schema_json_predicate
                                     (pcStack_50,&local_68,&local_48,&local_d8,&local_80,&local_58);
                pcVar14 = local_68;
                if (((int)local_34 < 1) ||
                   (iVar5 = strncmp(local_68,".",(long)local_48), iVar5 == 0)) {
                  cVar1 = pcStack_50[-(long)(int)local_34];
                  uVar4 = 0;
LAB_00115d59:
                  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)cVar1);
LAB_00115d69:
                  uVar6 = 0xffffffff;
                }
                else {
                  ppuVar11 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar11 + (long)*pcVar14 * 2 + 1) & 8) == 0) {
                    local_e0 = pcVar15;
                    uVar4 = 0;
                    if (node_00->schema->padding[2] == '\0') {
LAB_00115ea6:
                      uVar6 = 0;
                    }
                    else {
                      name_1 = (char *)node_00->child;
                      uVar6 = 1;
                      uVar4 = 0;
                      if ((lyd_node *)name_1 != (lyd_node *)0x0) {
                        uVar17 = 0;
                        local_a0 = pcStack_50;
                        last_has_pred = 0;
                        uVar6 = local_34;
                        do {
                          local_88 = (ulong)((int)uVar17 + uVar6);
                          pcVar15 = (char *)**(undefined8 **)name_1;
                          sVar16 = (size_t)local_48;
                          local_e8 = local_68;
                          local_34 = uVar6;
                          iVar5 = strncmp(pcVar15,local_68,sVar16);
                          if ((iVar5 != 0) || (pcVar15[sVar16] != '\0')) {
                            ly_vlog(LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,local_e8);
                            uVar6 = 0xffffffff;
                            uVar4 = (uint)local_88;
                            goto LAB_00115ea8;
                          }
                          pcVar15 = name_1;
                          if ((name_1[0x40] & 7U) == 0) {
LAB_00115c81:
                            pcVar15 = *(char **)(pcVar15 + 0x30);
                          }
                          else {
                            pcVar14 = *(char **)(name_1 + 0x30);
                            plVar9 = lyd_node_module(node_00);
                            __s2 = plVar9->name;
                            plVar9 = lyd_node_module(node_00);
                            sVar16 = strlen(plVar9->name);
                            pcVar15 = name_1;
                            iVar5 = strncmp(pcVar14,__s2,sVar16);
                            if (iVar5 != 0) goto LAB_00115c81;
                            lVar3 = *(long *)(pcVar15 + 0x30);
                            plVar9 = lyd_node_module(node_00);
                            sVar16 = strlen(plVar9->name);
                            if (*(char *)(lVar3 + sVar16) != ':') goto LAB_00115c81;
                            lVar3 = *(long *)(pcVar15 + 0x30);
                            plVar9 = lyd_node_module(node_00);
                            sVar16 = strlen(plVar9->name);
                            pcVar15 = (char *)(lVar3 + sVar16 + 1);
                          }
                          sVar16 = (size_t)local_80;
                          iVar5 = strncmp(pcVar15,local_d8,sVar16);
                          uVar17 = local_88;
                          uVar4 = (uint)local_88;
                          if ((iVar5 != 0) || (pcVar15[sVar16] != '\0')) {
                            uVar6 = 1;
                            goto LAB_00115ea8;
                          }
                          if ((ushort)node_00->schema->padding[2] <= (ushort)(last_has_pred + 1)) {
                            if (local_58 == 0) goto LAB_00115ea6;
                            code = LYE_PATH_INKEY;
                            pcVar15 = local_68;
LAB_00115ed4:
                            ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar15);
                            goto LAB_00115d69;
                          }
                          if (local_58 == 0) {
                            code = LYE_PATH_MISSKEY;
                            pcVar15 = local_e0;
                            goto LAB_00115ed4;
                          }
                          local_a0 = local_a0 + local_34;
                          name_1 = *(char **)(name_1 + 0x18);
                          last_has_pred = last_has_pred + 1;
                          uVar6 = parse_schema_json_predicate
                                            (local_a0,&local_68,&local_48,&local_d8,&local_80,
                                             &local_58);
                        } while ((0 < (int)uVar6) &&
                                (iVar5 = strncmp(local_68,".",(long)local_48), iVar5 != 0));
                        cVar1 = local_a0[-(long)(int)uVar6];
                        goto LAB_00115d59;
                      }
                    }
                  }
                  else {
                    iVar5 = atoi(pcVar14);
                    uVar6 = (uint)(iVar5 != llval_len);
                    uVar4 = local_34;
                    if (iVar5 != llval_len) {
                      uVar4 = 0;
                    }
                  }
                }
LAB_00115ea8:
                if (uVar6 == 1) goto LAB_00115eb1;
                if (uVar6 == 0xffffffff) goto LAB_0011601f;
                pcVar15 = pcStack_50 + (int)uVar4;
                iVar5 = uVar4 + (int)mod_name;
              }
              else {
                if (LVar2 != LYS_LEAFLIST) {
                  iVar5 = (int)mod_name;
                  pcVar15 = pcStack_50;
                  goto LAB_00115f89;
                }
                nam_len = 0;
                if (local_44 == 0) {
                  uVar4 = 0;
                  if (_pred_name_len != (char *)0x0) {
                    sVar16 = strlen(_pred_name_len);
                    val_len = (int)sVar16;
                  }
                }
                else {
                  uVar4 = parse_schema_json_predicate
                                    (pcStack_50,&local_100,&local_c0,(char **)&pred_name_len,
                                     &val_len,&nam_len);
                  if ((int)uVar4 < 1) {
                    cVar1 = *pcVar14;
                    goto LAB_001160df;
                  }
                  if ((*local_100 != '.') || (local_c0 != 1)) {
                    cVar1 = pcVar14[1];
                    pcVar14 = pcVar14 + 1;
                    goto LAB_001160df;
                  }
                }
                local_34 = uVar4;
                if ((node_00[1].validity & 7) == 0) {
LAB_00115e00:
                  plVar13 = node_00->child;
                }
                else {
                  plVar13 = node_00->child;
                  plVar9 = lyd_node_module(node_00);
                  pcVar15 = plVar9->name;
                  plVar9 = lyd_node_module(node_00);
                  sVar16 = strlen(plVar9->name);
                  iVar5 = strncmp((char *)plVar13,pcVar15,sVar16);
                  if (iVar5 != 0) goto LAB_00115e00;
                  plVar13 = node_00->child;
                  plVar9 = lyd_node_module(node_00);
                  sVar16 = strlen(plVar9->name);
                  if (*(char *)((long)&plVar13->schema + sVar16) != ':') goto LAB_00115e00;
                  plVar13 = node_00->child;
                  plVar9 = lyd_node_module(node_00);
                  sVar16 = strlen(plVar9->name);
                  plVar13 = (lyd_node *)((long)&plVar13->schema + sVar16 + 1);
                }
                if (((_pred_name_len == (char *)0x0) && (plVar13 != (lyd_node *)0x0)) &&
                   (*(char *)&plVar13->schema != '\0')) goto LAB_00115eb1;
                if (_pred_name_len != (char *)0x0) {
                  sVar16 = (size_t)val_len;
                  iVar5 = strncmp(_pred_name_len,(char *)plVar13,sVar16);
                  if ((iVar5 != 0) || (*(char *)((long)&plVar13->schema + sVar16) != '\0'))
                  goto LAB_00115eb1;
                }
                iVar5 = (int)mod_name + local_34;
                local_44 = nam_len;
                pcVar15 = pcStack_50 + local_34;
              }
LAB_00115f89:
              *_nam_len_1 = *_nam_len_1 + iVar5;
              uVar4 = (uint)*pcVar15;
              if (uVar4 == 0) {
                return node_00;
              }
              parsed = _nam_len_1;
              if ((node_00->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
              goto LAB_00115fd7;
              name = (char *)lyd_node_module(node_00);
              node = node_00->child;
              plVar13 = node_00;
              break;
            }
          }
LAB_00115eb1:
          node_00 = node_00->next;
          bVar18 = node_00 == (lyd_node *)0x0;
          pcVar15 = pcStack_50;
          plVar13 = local_c8;
        } while (!bVar18);
      }
      if (bVar18) {
        return plVar13;
      }
      uVar4 = parse_schema_nodeid(pcVar15,&local_98,&local_38,&llist_value_local,&local_7c,&local_54
                                  ,&local_44);
      if ((int)uVar4 < 1) goto LAB_001160a5;
      pcVar15 = pcVar15 + uVar4;
      mod_name = (char *)CONCAT44(extraout_var_00,uVar4);
    } while( true );
  }
  pcVar15 = nodeid + -uVar4;
  uVar4 = (uint)nodeid[-uVar4];
LAB_00115fd7:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar4,pcVar15);
  _nam_len_1 = parsed;
LAB_0011601f:
  *_nam_len_1 = -1;
  return (lyd_node *)0x0;
LAB_001160a5:
  pcVar14 = pcVar15 + -uVar4;
  cVar1 = pcVar15[-uVar4];
LAB_001160df:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)cVar1,pcVar14);
  goto LAB_0011601f;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *id, *mod_name, *name, *pred_name, *data_val;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed, llval_len, pred_name_len, last_has_pred;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prefix_mod, *prev_mod;
    struct ly_ctx *ctx;

    assert(nodeid && start && parsed);

    ctx = start->schema->module->ctx;
    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        *parsed = -1;
        return NULL;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed = r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = start->child;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }

    while (1) {
        list_instance_position = 0;

        LY_TREE_FOR(start, sibling) {
            /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
            if (lys_parent(sibling->schema)) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                }
            }

            /* name match */
            if (!strncmp(name, sibling->schema->name, nam_len) && !sibling->schema->name[nam_len]) {

                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        *parsed = -1;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lyd_node_module(sibling)) {
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (sibling->schema->nodetype == LYS_LEAFLIST) {
                    llist = (struct lyd_node_leaf_list *)sibling;

                    last_has_pred = 0;
                    if (has_predicate) {
                        if ((r = parse_schema_json_predicate(id, &pred_name, &pred_name_len, &llist_value, &llval_len, &last_has_pred)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                            *parsed = -1;
                            return NULL;
                        }
                        if ((pred_name[0] != '.') || (pred_name_len != 1)) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[1], id + 1);
                            *parsed = -1;
                            return NULL;
                        }
                    } else {
                        r = 0;
                        if (llist_value) {
                            llval_len = strlen(llist_value);
                        }
                    }

                    /* make value canonical */
                    if ((llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llist_value && data_val && data_val[0])
                            || (llist_value && (strncmp(llist_value, data_val, llval_len) || data_val[llval_len]))) {
                        continue;
                    }

                    id += r;
                    last_parsed += r;
                    has_predicate = last_has_pred;

                } else if (sibling->schema->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    if (!has_predicate) {
                        /* none match */
                        return last_match;
                    }

                    ++list_instance_position;
                    r = 0;
                    ret = resolve_partial_json_data_list_predicate(id, name, sibling, list_instance_position, &r);
                    if (ret == -1) {
                        *parsed = -1;
                        return NULL;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                    id += r;
                    last_parsed += r;
                }

                *parsed += last_parsed;

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    *parsed = -1;
                    return NULL;
                }
                last_match = sibling;
                prev_mod = lyd_node_module(sibling);
                start = sibling->child;
                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            return last_match;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            *parsed = -1;
            return NULL;
        }
        id += r;
        last_parsed = r;
    }

    /* cannot get here */
    LOGINT;
    *parsed = -1;
    return NULL;
}